

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

bool __thiscall Process::Arguments::nextChar(Arguments *this)

{
  char **ppcVar1;
  
  if (*this->arg == '\0') {
    ppcVar1 = this->argv;
    if (this->argvEnd <= ppcVar1) {
      return false;
    }
    this->argv = ppcVar1 + 1;
    this->arg = *ppcVar1;
    this->inOpt = false;
  }
  else {
    this->arg = this->arg + 1;
  }
  return true;
}

Assistant:

bool Process::Arguments::nextChar()
{
  if(*arg)
  {
    ++arg;
    return true;
  }
  if(argv < argvEnd)
  {
    arg = *(argv++);
    inOpt = false;
    return true;
  }
  return false;
}